

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_boolean_test.cpp
# Opt level: O2

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::Transformer::TransformBooleanTest(Transformer *this,PGBooleanTest *node)

{
  NotImplementedException *this_00;
  long in_RDX;
  undefined1 local_80 [16];
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_70;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_68;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_60;
  __node_base local_58;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_50;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_48;
  string local_40;
  
  TransformExpression((Transformer *)local_80,(optional_ptr<duckdb_libpgquery::PGNode,_true>)node);
  switch(*(undefined4 *)(in_RDX + 0x10)) {
  case 0:
    local_48._M_head_impl = (ParsedExpression *)local_80._0_8_;
    local_80._0_8_ = (Transformer *)0x0;
    TransformBooleanTestInternal
              ((duckdb *)this,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&local_48,COMPARE_BOUNDARY_END,true,*(int *)(in_RDX + 0x14));
    if ((Transformer *)local_48._M_head_impl != (Transformer *)0x0) {
      (*(code *)((Transformer *)((local_48._M_head_impl)->super_BaseExpression)._vptr_BaseExpression
                )->options)();
    }
    local_48._M_head_impl = (ParsedExpression *)0x0;
    break;
  case 1:
    local_50._M_head_impl = (ParsedExpression *)local_80._0_8_;
    local_80._0_8_ = (Transformer *)0x0;
    TransformBooleanTestInternal
              ((duckdb *)this,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&local_50,COMPARE_DISTINCT_FROM,true,*(int *)(in_RDX + 0x14));
    if ((Transformer *)local_50._M_head_impl != (Transformer *)0x0) {
      (*(code *)((Transformer *)((local_50._M_head_impl)->super_BaseExpression)._vptr_BaseExpression
                )->options)();
    }
    local_50._M_head_impl = (ParsedExpression *)0x0;
    break;
  case 2:
    local_58._M_nxt = (_Hash_node_base *)local_80._0_8_;
    local_80._0_8_ = (Transformer *)0x0;
    TransformBooleanTestInternal
              ((duckdb *)this,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&local_58,COMPARE_BOUNDARY_END,false,*(int *)(in_RDX + 0x14));
    if ((Transformer *)local_58._M_nxt != (Transformer *)0x0) {
      (*(code *)((optional_ptr<duckdb::Transformer,_true> *)&(local_58._M_nxt)->_M_nxt)->ptr->
                options)();
    }
    local_58._M_nxt = (_Hash_node_base *)0x0;
    break;
  case 3:
    local_60._M_head_impl = (ParsedExpression *)local_80._0_8_;
    local_80._0_8_ = (Transformer *)0x0;
    TransformBooleanTestInternal
              ((duckdb *)this,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&local_60,COMPARE_DISTINCT_FROM,false,*(int *)(in_RDX + 0x14));
    if ((Transformer *)local_60._M_head_impl != (Transformer *)0x0) {
      (*(code *)((Transformer *)((local_60._M_head_impl)->super_BaseExpression)._vptr_BaseExpression
                )->options)();
    }
    local_60._M_head_impl = (ParsedExpression *)0x0;
    break;
  case 4:
    local_68._M_head_impl = (ParsedExpression *)local_80._0_8_;
    local_80._0_8_ = (Transformer *)0x0;
    TransformBooleanTestIsNull
              ((duckdb *)this,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&local_68,OPERATOR_IS_NULL,*(int *)(in_RDX + 0x14));
    if ((Transformer *)local_68._M_head_impl != (Transformer *)0x0) {
      (*(code *)((Transformer *)((local_68._M_head_impl)->super_BaseExpression)._vptr_BaseExpression
                )->options)();
    }
    local_68._M_head_impl = (ParsedExpression *)0x0;
    break;
  case 5:
    local_70._M_head_impl = (ParsedExpression *)local_80._0_8_;
    local_80._0_8_ = (Transformer *)0x0;
    TransformBooleanTestIsNull
              ((duckdb *)this,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&local_70,OPERATOR_IS_NOT_NULL,*(int *)(in_RDX + 0x14));
    if ((Transformer *)local_70._M_head_impl != (Transformer *)0x0) {
      (*(code *)((Transformer *)((local_70._M_head_impl)->super_BaseExpression)._vptr_BaseExpression
                )->options)();
    }
    local_70._M_head_impl = (ParsedExpression *)0x0;
    break;
  default:
    this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_40,"Unknown boolean test type %d",(allocator *)(local_80 + 0xf));
    NotImplementedException::NotImplementedException<duckdb_libpgquery::PGBoolTestType>
              (this_00,&local_40,*(PGBoolTestType *)(in_RDX + 0x10));
    __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if ((Transformer *)local_80._0_8_ != (Transformer *)0x0) {
    (*(code *)((optional_ptr<duckdb::Transformer,_true> *)local_80._0_8_)->ptr->options)();
  }
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

unique_ptr<ParsedExpression> Transformer::TransformBooleanTest(duckdb_libpgquery::PGBooleanTest &node) {
	auto argument = TransformExpression(PGPointerCast<duckdb_libpgquery::PGNode>(node.arg));

	switch (node.booltesttype) {
	case duckdb_libpgquery::PGBoolTestType::PG_IS_TRUE:
		return TransformBooleanTestInternal(std::move(argument), ExpressionType::COMPARE_NOT_DISTINCT_FROM, true,
		                                    node.location);
	case duckdb_libpgquery::PGBoolTestType::IS_NOT_TRUE:
		return TransformBooleanTestInternal(std::move(argument), ExpressionType::COMPARE_DISTINCT_FROM, true,
		                                    node.location);
	case duckdb_libpgquery::PGBoolTestType::IS_FALSE:
		return TransformBooleanTestInternal(std::move(argument), ExpressionType::COMPARE_NOT_DISTINCT_FROM, false,
		                                    node.location);
	case duckdb_libpgquery::PGBoolTestType::IS_NOT_FALSE:
		return TransformBooleanTestInternal(std::move(argument), ExpressionType::COMPARE_DISTINCT_FROM, false,
		                                    node.location);
	case duckdb_libpgquery::PGBoolTestType::IS_UNKNOWN: // IS NULL
		return TransformBooleanTestIsNull(std::move(argument), ExpressionType::OPERATOR_IS_NULL, node.location);
	case duckdb_libpgquery::PGBoolTestType::IS_NOT_UNKNOWN: // IS NOT NULL
		return TransformBooleanTestIsNull(std::move(argument), ExpressionType::OPERATOR_IS_NOT_NULL, node.location);
	default:
		throw NotImplementedException("Unknown boolean test type %d", node.booltesttype);
	}
}